

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O2

spv_result_t spvtools::val::FirstBlockAssert(ValidationState_t *_,uint32_t target)

{
  bool bVar1;
  Function *pFVar2;
  Instruction *inst;
  BasicBlock *pBVar3;
  spv_result_t sVar4;
  string sStack_268;
  string local_248;
  string local_228;
  DiagnosticStream local_208;
  
  pFVar2 = ValidationState_t::current_function(_);
  bVar1 = Function::IsFirstBlock(pFVar2,target);
  sVar4 = SPV_SUCCESS;
  if (bVar1) {
    pFVar2 = ValidationState_t::current_function(_);
    inst = ValidationState_t::FindDef(_,pFVar2->id_);
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CFG,inst);
    std::operator<<((ostream *)&local_208,"First block ");
    ValidationState_t::getIdName_abi_cxx11_(&local_228,_,target);
    std::operator<<((ostream *)&local_208,(string *)&local_228);
    std::operator<<((ostream *)&local_208," of function ");
    pFVar2 = ValidationState_t::current_function(_);
    ValidationState_t::getIdName_abi_cxx11_(&local_248,_,pFVar2->id_);
    std::operator<<((ostream *)&local_208,(string *)&local_248);
    std::operator<<((ostream *)&local_208," is targeted by block ");
    pFVar2 = ValidationState_t::current_function(_);
    pBVar3 = Function::current_block(pFVar2);
    ValidationState_t::getIdName_abi_cxx11_(&sStack_268,_,pBVar3->id_);
    std::operator<<((ostream *)&local_208,(string *)&sStack_268);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    DiagnosticStream::~DiagnosticStream(&local_208);
    sVar4 = local_208.error_;
  }
  return sVar4;
}

Assistant:

spv_result_t FirstBlockAssert(ValidationState_t& _, uint32_t target) {
  if (_.current_function().IsFirstBlock(target)) {
    return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(_.current_function().id()))
           << "First block " << _.getIdName(target) << " of function "
           << _.getIdName(_.current_function().id()) << " is targeted by block "
           << _.getIdName(_.current_function().current_block()->id());
  }
  return SPV_SUCCESS;
}